

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidget::focusNextPrevChild(QWidget *this,bool next)

{
  byte bVar1;
  bool bVar2;
  WindowType WVar3;
  FocusReason FVar4;
  QWidget *this_00;
  pointer pQVar5;
  QWidget *pQVar6;
  QWindow *pQVar7;
  long lVar8;
  byte in_SIL;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWindowPrivate *winp;
  QWindow *window;
  FocusReason reason;
  QWidget *w;
  QWidgetPrivate *d;
  bool isSubWindow;
  QWidget *p;
  bool wrappingOccurred;
  QFocusEvent event;
  undefined4 in_stack_ffffffffffffffbc;
  FocusReason reason_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 next_00;
  undefined6 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffde;
  byte bVar9;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  pQVar6 = in_RDI;
  this_00 = parentWidget((QWidget *)0x3735b9);
  next_00 = (undefined1)((ulong)pQVar6 >> 0x38);
  WVar3 = windowType(in_RDI);
  reason_00 = CONCAT13(WVar3 == SubWindow,(int3)in_stack_ffffffffffffffbc);
  bVar2 = isWindow(in_RDI);
  if (((bVar2) || ((reason_00 & 0x1000000) != MouseFocusReason)) || (this_00 == (QWidget *)0x0)) {
    d_func((QWidget *)0x37361e);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x373631);
    if ((bVar2) &&
       (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x373645),
       pQVar5->proxyWidget != (QGraphicsProxyWidget *)0x0)) {
      pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37365a);
      in_stack_ffffffffffffffde =
           (**(code **)(*(long *)&(pQVar5->proxyWidget->super_QGraphicsWidget).super_QGraphicsObject
                       + 0xf0))(pQVar5->proxyWidget,bVar1 & 1);
      in_stack_ffffffffffffffde = in_stack_ffffffffffffffde & 1;
    }
    else {
      bVar9 = 0;
      pQVar6 = QApplicationPrivate::focusNextPrevChild_helper
                         ((QWidget *)
                          (ulong)CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),
                          (bool)next_00,(bool *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
      if (pQVar6 == (QWidget *)0x0) {
        in_stack_ffffffffffffffde = 0;
      }
      else {
        FVar4 = BacktabFocusReason;
        if ((bVar1 & 1) != 0) {
          FVar4 = TabFocusReason;
        }
        if ((((bVar9 & 1) != 0) && (pQVar7 = windowHandle(in_RDI), pQVar7 != (QWindow *)0x0)) &&
           (lVar8 = qt_window_private(pQVar7), *(long *)(lVar8 + 0x88) != 0)) {
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusIn,FVar4);
          QEvent::ignore((QEvent *)&local_20);
          (**(code **)(**(long **)(lVar8 + 0x88) + 0x130))(*(long **)(lVar8 + 0x88),&local_20);
          bVar2 = QEvent::isAccepted((QEvent *)&local_20);
          if (bVar2) {
            in_stack_ffffffffffffffde = 1;
          }
          QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
          if (bVar2) goto LAB_003737c1;
        }
        setFocus(this_00,reason_00);
        in_stack_ffffffffffffffde = 1;
      }
    }
  }
  else {
    in_stack_ffffffffffffffde = (**(code **)(*(long *)this_00 + 0x198))(this_00,bVar1 & 1);
    in_stack_ffffffffffffffde = in_stack_ffffffffffffffde & 1;
  }
LAB_003737c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffffde & 1);
}

Assistant:

bool QWidget::focusNextPrevChild(bool next)
{
    QWidget* p = parentWidget();
    bool isSubWindow = (windowType() == Qt::SubWindow);
    if (!isWindow() && !isSubWindow && p)
        return p->focusNextPrevChild(next);
#if QT_CONFIG(graphicsview)
    Q_D(QWidget);
    if (d->extra && d->extra->proxyWidget)
        return d->extra->proxyWidget->focusNextPrevChild(next);
#endif

    bool wrappingOccurred = false;
    QWidget *w = QApplicationPrivate::focusNextPrevChild_helper(this, next,
                                                                &wrappingOccurred);
    if (!w) return false;

    Qt::FocusReason reason = next ? Qt::TabFocusReason : Qt::BacktabFocusReason;

    /* If we are about to wrap the focus chain, give the platform
     * implementation a chance to alter the wrapping behavior.  This is
     * especially needed when the window is embedded in a window created by
     * another process.
     */
    if (wrappingOccurred) {
        QWindow *window = windowHandle();
        if (window != nullptr) {
            QWindowPrivate *winp = qt_window_private(window);

            if (winp->platformWindow != nullptr) {
                QFocusEvent event(QEvent::FocusIn, reason);
                event.ignore();
                winp->platformWindow->windowEvent(&event);
                if (event.isAccepted()) return true;
            }
        }
    }

    w->setFocus(reason);
    return true;
}